

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall
pybind11::capsule::capsule<pybind11::detail::accessor_policies::generic_item>
          (capsule *this,accessor<pybind11::detail::accessor_policies::generic_item> *a)

{
  PyObject *pPVar1;
  object *poVar2;
  long *plVar3;
  handle local_18;
  
  poVar2 = detail::accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(a);
  pPVar1 = (poVar2->super_handle).m_ptr;
  local_18.m_ptr = pPVar1;
  plVar3 = (long *)__tls_get_addr(&PTR_0013fe00);
  *plVar3 = *plVar3 + 1;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  capsule(this,(object *)&local_18);
  object::~object((object *)&local_18);
  return;
}

Assistant:

capsule(PyObject *ptr, bool is_borrowed)
        : object(is_borrowed ? object(ptr, borrowed_t{}) : object(ptr, stolen_t{})) {}